

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O1

vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
* field::compute_powers
            (vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
             *__return_storage_ptr__,vector<field::GF2E,_std::allocator<field::GF2E>_> *Rs,
            size_t maxpow)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  allocator_type local_48 [24];
  
  std::
  vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3,local_48);
  if ((Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::resize
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar6,maxpow);
      *(__return_storage_ptr__->
       super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[uVar6].
       super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>._M_impl.super__Vector_impl_data
       ._M_start = 1;
      if (1 < maxpow) {
        lVar5 = 0;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl
                         .super__Vector_impl_data._M_start[uVar6].data;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(*(long *)&(__return_storage_ptr__->
                                              super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                              super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>
                                              ._M_impl.super__Vector_impl_data + lVar5 * 8);
          local_48._0_16_ = (undefined1  [16])0x0;
          for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
            if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
              local_48._0_16_ = local_48._0_16_ ^ auVar3 << uVar1;
            }
          }
          if (GF2E::reduce._16_8_ == 0) {
            std::__throw_bad_function_call();
          }
          uVar4 = (*(code *)GF2E::reduce._24_8_)(GF2E::reduce,local_48);
          *(undefined8 *)
           (*(long *)&(__return_storage_ptr__->
                      super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar6].
                      super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>._M_impl.
                      super__Vector_impl_data + 8 + lVar5 * 8) = uVar4;
          lVar5 = lVar5 + 1;
        } while (maxpow - 1 != lVar5);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(Rs->
                                   super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(Rs->
                                   super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<GF2E>> compute_powers(std::vector<GF2E> Rs, size_t maxpow)
{
   std::vector<std::vector<GF2E>> res(Rs.size());
   for (size_t nbel = 0; nbel < Rs.size(); nbel ++)
   {
      res[nbel].resize(maxpow);
      res[nbel][0] = 1;
      for (size_t i=1; i < maxpow ; i++)
      {
         res[nbel][i] = res[nbel][i-1]*Rs[nbel];
      }
   }

   return res;
}